

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
::ThreadData::put_one(ThreadData *this)

{
  QueueTesterFlags QVar1;
  size_type sVar2;
  int64_t iVar3;
  function<void_()> local_48;
  undefined1 local_28 [8];
  anon_class_16_2_42c33408 put_func;
  unsigned_long type_index;
  ThreadData *this_local;
  
  sVar2 = std::
          vector<bool_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&)>_>
          ::size((vector<bool_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&)>_>
                  *)(*(long *)(this + 8) + 0x40));
  put_func.type_index =
       (unsigned_long *)EasyRandom::get_int<unsigned_long>((EasyRandom *)(this + 0x50),sVar2 - 1);
  put_func.this = (ThreadData *)&put_func.type_index;
  local_28 = (undefined1  [8])this;
  QVar1 = operator&(*(QueueTesterFlags *)(this + 0x10),eTestExceptions);
  if (QVar1 == eTestExceptions) {
    std::function<void()>::
    function<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::ThreadData::put_one()::_lambda()_1_&,void>
              ((function<void()> *)&local_48,(anon_class_16_2_42c33408 *)local_28);
    iVar3 = run_exception_test(&local_48);
    *(int64_t *)(this + 0x38) = iVar3 + *(long *)(this + 0x38);
    std::function<void_()>::~function(&local_48);
  }
  else {
    put_one::anon_class_16_2_42c33408::operator()((anon_class_16_2_42c33408 *)local_28);
  }
  return;
}

Assistant:

void put_one()
            {
                /* pick a random type (outside the exception loop) to have a deterministic and exhaustive
                    exception test at least in isolation (in single-thread tests). */
                const auto type_index =
                  m_random.get_int<size_t>(m_parent_tester.m_put_cases.size() - 1);

                auto put_func = [&] {
                    if (m_random.get_bool())
                    {
                        bool put_done =
                          (*m_parent_tester.m_put_cases[type_index])(m_queue, m_random);
                        if (put_done)
                        {
                            // done! From now on no exception can occur
                            auto & counters = m_final_stats.m_counters[type_index];
                            counters.m_existing++;
                            counters.m_spawned++;

                            m_put_committed++;
                        }
                    }
                    else
                    {
                        auto transaction =
                          (*m_parent_tester.m_reentrant_put_cases[type_index])(m_queue, m_random);
                        if (transaction)
                        {
                            m_pending_reentrant_puts.push_back(
                              ReentrantPut(type_index, std::move(transaction)));
                        }
                    }
                };

                if (
                  (m_flags & QueueTesterFlags::eTestExceptions) ==
                  QueueTesterFlags::eTestExceptions)
                {
                    m_final_stats.m_exceptions_during_puts += run_exception_test(put_func);
                }
                else
                {
                    put_func();
                }
            }